

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O0

void fast_test(void)

{
  PtTimestamp PVar1;
  int iVar2;
  int iVar3;
  int local_7c;
  int send_total;
  int printtime;
  int pitch;
  int msgcnt;
  PmTimestamp now;
  PmTimestamp start;
  char line [80];
  PortMidiStream *local_10;
  PortMidiStream *midi;
  
  Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
  Pm_OpenOutput(&local_10,deviceno,(void *)0x0,0,Pt_Time,(void *)0x0,latency);
  printf("Midi Output opened with %ld ms latency.\n",(long)latency);
  PVar1 = Pt_Time();
  iVar2 = PVar1 + 1000;
  while (PVar1 = Pt_Time(), PVar1 < iVar2) {
    usleep(10000);
  }
  printf("sending output...\n");
  fflush(_stdout);
  pitch = Pt_Time();
  printtime = 0;
  send_total = 0x3c;
  local_7c = 1000;
  if (expired_timestamps != 0) {
    pitch = pitch + latency * -2;
  }
  while (SBORROW4(pitch - iVar2,duration * 1000) != (pitch - iVar2) + duration * -1000 < 0) {
    iVar3 = (pitch - iVar2) * msgrate;
    while (printtime < iVar3 / 1000) {
      Pm_WriteShort(local_10,pitch,(send_total & 0xffU) << 8 | 0x640090);
      Pm_WriteShort(local_10,pitch,(send_total & 0xffU) << 8 | 0x90);
      printtime = printtime + 2;
      send_total = (send_total + -0x3b) % 0xc + 0x3c;
      if (local_7c <= pitch - iVar2) {
        printf("%d at %dms\n",(ulong)(uint)printtime,(ulong)(uint)(pitch - iVar2));
        fflush(_stdout);
        local_7c = local_7c + 1000;
      }
    }
    pitch = Pt_Time();
  }
  printf("ready to close and terminate... (type RETURN):");
  fgets((char *)&now,0x50,_stdin);
  Pm_Close(local_10);
  Pm_Terminate();
  printf("done closing and terminating...\n");
  return;
}

Assistant:

void fast_test()
{
    PmStream * midi;
	char line[80];

    /* It is recommended to start timer before PortMidi */
    TIME_START;

	/* open output device */
    Pm_OpenOutput(&midi, 
                  deviceno, 
                  DRIVER_INFO,
                  OUTPUT_BUFFER_SIZE, 
                  (int32_t (*)(void *)) Pt_Time,
                  NULL,
                  latency);
    printf("Midi Output opened with %ld ms latency.\n", (long) latency);

    /* wait a sec after printing previous line */
    PmTimestamp start = Pt_Time() + 1000;
    while (start > Pt_Time()) {
        Sleep(10);
    }
    printf("sending output...\n");
    fflush(stdout); /* make sure message goes to console */

    /* every 10ms send on/off pairs at timestamps set to current time */
    PmTimestamp now = Pt_Time();
    int msgcnt = 0;
    int pitch = 60;
    int printtime = 1000;
    /* if expired_timestamps, we want to send timestamps that have
     * expired. They should be sent immediately, but there's a suggestion
     * that negative delay might cause problems in the ALSA implementation
     * so this is something we can test using the -n flag.
     */
    if (expired_timestamps) {
        now = now - 2 * latency;
    }
    while (now - start < duration *  1000) {
        /* how many messages do we send? Total should be
         *     (elapsed * rate) / 1000
         */
        int send_total = ((now - start) * msgrate) / 1000;
        while (msgcnt < send_total) {
            Pm_WriteShort(midi, now, Pm_Message(0x90, pitch, 100));
            Pm_WriteShort(midi, now, Pm_Message(0x90, pitch, 0));
            msgcnt += 2;
            /* play 60, 61, 62, ... 71, then wrap back to 60, 61, ... */
            pitch = (pitch - 59) % 12 + 60;
            if (now - start >= printtime) {
                printf("%d at %dms\n", msgcnt, now - start);
                fflush(stdout); /* make sure message goes to console */
                printtime += 1000; /* next msg in 1s */
            }
        }
        now = Pt_Time();
    }
    /* close device (this not explicitly needed in most implementations) */
    printf("ready to close and terminate... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
	
    Pm_Close(midi);
    Pm_Terminate();
    printf("done closing and terminating...\n");
}